

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

size_t anon_unknown.dwarf_5601::GetSizeWithCallback
                 (void *ptr,_func_size_t_void_ptr *invalid_getsize_fn)

{
  void *pvVar1;
  bool bVar2;
  PageHeap *this;
  SizeMap *pSVar3;
  size_t orig_size;
  Span *span;
  ulong uStack_80;
  uint32_t cl;
  PageID p;
  _func_size_t_void_ptr *invalid_getsize_fn_local;
  void *ptr_local;
  ulong local_40;
  PageHeap *local_38;
  ulong local_30;
  Number i2;
  Number i1;
  PageMap *local_18;
  void *local_10;
  
  if (ptr == (void *)0x0) {
    ptr_local = (void *)0x0;
  }
  else {
    uStack_80 = (ulong)ptr >> 0xd;
    p = (PageID)invalid_getsize_fn;
    invalid_getsize_fn_local = (_func_size_t_void_ptr *)ptr;
    this = tcmalloc::Static::pageheap();
    bVar2 = tcmalloc::PageHeap::TryGetSizeClass(this,uStack_80,(uint32_t *)((long)&span + 4));
    if (bVar2) {
      pSVar3 = tcmalloc::Static::sizemap();
      ptr_local = (void *)(long)pSVar3->class_to_size_[span._4_4_];
    }
    else {
      local_38 = tcmalloc::Static::pageheap();
      local_40 = uStack_80;
      local_18 = &local_38->pagemap_;
      i1 = uStack_80;
      i2 = uStack_80 >> 0x12;
      local_30 = uStack_80 & 0x3ffff;
      if ((uStack_80 >> 0x23 == 0) && (local_18->root_[i2] != (Leaf *)0x0)) {
        local_10 = local_18->root_[i2]->values[local_30];
      }
      else {
        local_10 = (void *)0x0;
      }
      pvVar1 = local_10;
      if (local_10 == (void *)0x0) {
        ptr_local = (void *)(*(code *)p)(invalid_getsize_fn_local);
      }
      else if ((*(uint *)((long)local_10 + 0x28) >> 0x10 & 0xff) == 0) {
        if ((*(uint *)((long)local_10 + 0x28) >> 0x1a & 1) == 0) {
          ptr_local = (void *)(*(long *)((long)local_10 + 8) << 0xd);
        }
        else {
          ptr_local = (void *)tc_nallocx(**(size_t **)((long)local_10 + 0x20),0);
        }
      }
      else {
        pSVar3 = tcmalloc::Static::sizemap();
        ptr_local = (void *)(long)pSVar3->class_to_size_
                                  [*(uint *)((long)pvVar1 + 0x28) >> 0x10 & 0xff];
      }
    }
  }
  return (size_t)ptr_local;
}

Assistant:

inline size_t GetSizeWithCallback(const void* ptr,
                                  size_t (*invalid_getsize_fn)(const void*)) {
  if (ptr == nullptr)
    return 0;
  const PageID p = reinterpret_cast<uintptr_t>(ptr) >> kPageShift;
  uint32_t cl;
  if (Static::pageheap()->TryGetSizeClass(p, &cl)) {
    return Static::sizemap()->ByteSizeForClass(cl);
  }

  const Span *span = Static::pageheap()->GetDescriptor(p);
  if (PREDICT_FALSE(span == nullptr)) {  // means we do not own this memory
    return (*invalid_getsize_fn)(ptr);
  }

  if (span->sizeclass != 0) {
    return Static::sizemap()->ByteSizeForClass(span->sizeclass);
  }

  if (span->sample) {
    size_t orig_size = reinterpret_cast<StackTrace*>(span->objects)->size;
    return tc_nallocx(orig_size, 0);
  }

  return span->length << kPageShift;
}